

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseRunner.hpp
# Opt level: O0

void __thiscall
Centaurus::BaseRunner::BaseRunner
          (BaseRunner *this,char *filename,size_t bank_size,int bank_num,int pid)

{
  int __fd;
  void *pvVar1;
  undefined1 local_d0 [8];
  stat sb;
  int fd;
  int pid_local;
  int bank_num_local;
  size_t bank_size_local;
  char *filename_local;
  BaseRunner *this_local;
  
  BaseListener::BaseListener(&this->super_BaseListener);
  (this->super_BaseListener)._vptr_BaseListener = (_func_int **)&PTR__BaseRunner_002c11a8;
  this->m_bank_size = bank_size;
  this->m_bank_num = bank_num;
  __fd = open(filename,0);
  fstat(__fd,(stat *)local_d0);
  this->m_input_size = sb.st_rdev;
  pvVar1 = mmap((void *)0x0,sb.st_rdev,1,1,__fd,0);
  this->m_input_window = pvVar1;
  close(__fd);
  snprintf(this->m_memory_name,0x100,"/%s%s[%d]Window","{57DF45C9-6D0C-4DD2-9B41-B71F8CF66B13}",
           "Centaurus",(ulong)(uint)pid);
  snprintf(this->m_slave_lock_name,0x100,"/%s%s[%d]SlaveLock",
           "{57DF45C9-6D0C-4DD2-9B41-B71F8CF66B13}","Centaurus",(ulong)(uint)pid);
  return;
}

Assistant:

BaseRunner(const char *filename, size_t bank_size, int bank_num, int pid = get_current_pid())
		: m_bank_size(bank_size), m_bank_num(bank_num)
	{
#if defined(CENTAURUS_BUILD_WINDOWS)
		HANDLE hInputFile = CreateFileA(filename, GENERIC_READ, FILE_SHARE_READ | FILE_SHARE_WRITE, NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, 0);

        DWORD dwFileSizeHigh;
        DWORD dwFileSize = GetFileSize(hInputFile, &dwFileSizeHigh);
        m_input_size = ((size_t)dwFileSizeHigh << 32) | dwFileSize;

		HANDLE hInputMapping = CreateFileMappingA(hInputFile, NULL, PAGE_READONLY, dwFileSizeHigh, dwFileSize, NULL);

        m_input_window = MapViewOfFile(hInputMapping, FILE_MAP_READ, 0, 0, 0);

        //volatile char a = *((const char *)m_input_window + (m_input_size - 1));

        //CloseHandle(hInputMapping);
        //CloseHandle(hInputFile);

		sprintf(m_memory_name, "%s%s[%u]Window", PROGRAM_UUID, PROGRAM_NAME, pid);

		sprintf(m_slave_lock_name, "%s%s[%u]SlaveLock", PROGRAM_UUID, PROGRAM_NAME, pid);
#elif defined(CENTAURUS_BUILD_LINUX)
        int fd = open(filename, O_RDONLY);

        struct stat sb;
        fstat(fd, &sb);
        m_input_size = sb.st_size;

        m_input_window = mmap(NULL, sb.st_size, PROT_READ, MAP_SHARED, fd, 0);

        close(fd);

        snprintf(m_memory_name, sizeof(m_memory_name), "/%s%s[%d]Window", PROGRAM_UUID, PROGRAM_NAME, pid);

		snprintf(m_slave_lock_name, sizeof(m_slave_lock_name), "/%s%s[%d]SlaveLock", PROGRAM_UUID, PROGRAM_NAME, pid);
#endif
	}